

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_object_fromEntries(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  int iVar2;
  ulong uVar3;
  JSValue this_obj;
  JSValue JVar4;
  JSValue JVar5;
  JSValue v;
  JSValue v_00;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff7c;
  BOOL *in_stack_ffffffffffffff80;
  BOOL done;
  JSValueUnion local_50;
  ulong local_48;
  JSValue local_40;
  
  JVar4 = *argv;
  this_obj = JS_NewObject(ctx);
  if ((int)this_obj.tag == 6) {
    uVar3 = (ulong)this_obj.u.ptr & 0xffffffff00000000;
  }
  else {
    JVar4 = JS_GetIterator(ctx,JVar4,0);
    uVar3 = JVar4.tag & 0xffffffff;
    if (uVar3 == 6) {
      JVar5 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      uVar6 = 0;
      local_48 = uVar3;
      JVar5 = JS_GetPropertyInternal(ctx,JVar4,0x6a,JVar4,0);
      JVar1 = JVar4.u;
      if ((int)JVar5.tag != 6) {
        while( true ) {
          local_50 = JVar1;
          v = JS_IteratorNext(ctx,JVar4,JVar5,(int)&done,
                              (JSValue *)CONCAT44(in_stack_ffffffffffffff7c,uVar6),
                              in_stack_ffffffffffffff80);
          if ((v.tag & 0xffffffffU) == 6) break;
          if (done != 0) {
            JS_FreeValue(ctx,v);
            JS_FreeValue(ctx,JVar5);
            JS_FreeValue(ctx,JVar4);
            uVar3 = (ulong)this_obj.u.ptr & 0xffffffff00000000;
            goto LAB_001528ca;
          }
          if ((int)v.tag != -1) {
            JS_ThrowTypeErrorNotAnObject(ctx);
LAB_00152851:
            JS_FreeValue(ctx,v);
            JVar4.tag = JVar4.tag;
            JVar4.u.float64 = local_50.float64;
            break;
          }
          v_00 = JS_GetPropertyUint32(ctx,v,0);
          if ((int)v_00.tag == 6) goto LAB_00152851;
          local_40 = JS_GetPropertyUint32(ctx,v,1);
          if ((int)local_40.tag == 6) {
            JS_FreeValue(ctx,v_00);
            goto LAB_00152851;
          }
          uVar6 = local_40.u._0_4_;
          in_stack_ffffffffffffff7c = local_40.u._4_4_;
          in_stack_ffffffffffffff80 = (BOOL *)local_40.tag;
          iVar2 = JS_DefinePropertyValueValue(ctx,this_obj,v_00,local_40,0x4007);
          if (iVar2 < 0) goto LAB_00152851;
          JS_FreeValue(ctx,v);
          JVar4.tag = JVar4.tag;
          JVar4.u.ptr = local_50.ptr;
          JVar1 = local_50;
        }
      }
      if ((int)local_48 == -1) {
        JS_IteratorClose(ctx,JVar4,1);
      }
    }
    JS_FreeValue(ctx,JVar5);
    JS_FreeValue(ctx,JVar4);
    JS_FreeValue(ctx,this_obj);
    this_obj = (JSValue)(ZEXT816(6) << 0x40);
    uVar3 = 0;
  }
LAB_001528ca:
  JVar5.u.ptr = (void *)((ulong)this_obj.u.ptr & 0xffffffff | uVar3);
  JVar5.tag = this_obj.tag;
  return JVar5;
}

Assistant:

static JSValue js_object_fromEntries(JSContext *ctx, JSValueConst this_val,
                                     int argc, JSValueConst *argv)
{
    JSValue obj, iter, next_method = JS_UNDEFINED;
    JSValueConst iterable;
    BOOL done;

    /*  RequireObjectCoercible() not necessary because it is tested in
        JS_GetIterator() by JS_GetProperty() */
    iterable = argv[0];

    obj = JS_NewObject(ctx);
    if (JS_IsException(obj))
        return obj;
    
    iter = JS_GetIterator(ctx, iterable, FALSE);
    if (JS_IsException(iter))
        goto fail;
    next_method = JS_GetProperty(ctx, iter, JS_ATOM_next);
    if (JS_IsException(next_method))
        goto fail;
    
    for(;;) {
        JSValue key, value, item;
        item = JS_IteratorNext(ctx, iter, next_method, 0, NULL, &done);
        if (JS_IsException(item))
            goto fail;
        if (done) {
            JS_FreeValue(ctx, item);
            break;
        }
        
        key = JS_UNDEFINED;
        value = JS_UNDEFINED;
        if (!JS_IsObject(item)) {
            JS_ThrowTypeErrorNotAnObject(ctx);
            goto fail1;
        }
        key = JS_GetPropertyUint32(ctx, item, 0);
        if (JS_IsException(key))
            goto fail1;
        value = JS_GetPropertyUint32(ctx, item, 1);
        if (JS_IsException(value)) {
            JS_FreeValue(ctx, key);
            goto fail1;
        }
        if (JS_DefinePropertyValueValue(ctx, obj, key, value,
                                        JS_PROP_C_W_E | JS_PROP_THROW) < 0) {
        fail1:
            JS_FreeValue(ctx, item);
            goto fail;
        }
        JS_FreeValue(ctx, item);
    }
    JS_FreeValue(ctx, next_method);
    JS_FreeValue(ctx, iter);
    return obj;
 fail:
    if (JS_IsObject(iter)) {
        /* close the iterator object, preserving pending exception */
        JS_IteratorClose(ctx, iter, TRUE);
    }
    JS_FreeValue(ctx, next_method);
    JS_FreeValue(ctx, iter);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}